

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

TFileStream * FileStream_CreateFile(TCHAR *szFileName,DWORD dwStreamFlags)

{
  bool bVar1;
  TFileStream *local_28;
  TFileStream *pStream;
  DWORD dwStreamFlags_local;
  TCHAR *szFileName_local;
  
  if ((dwStreamFlags & 0xff) == 0) {
    local_28 = AllocateFileStream(szFileName,0x100,dwStreamFlags);
    if (local_28 != (TFileStream *)0x0) {
      bVar1 = BaseFile_Create(local_28);
      if (bVar1) {
        local_28->StreamRead = local_28->BaseRead;
        local_28->StreamWrite = local_28->BaseWrite;
        local_28->StreamResize = local_28->BaseResize;
        local_28->StreamGetSize = local_28->BaseGetSize;
        local_28->StreamGetPos = local_28->BaseGetPos;
        local_28->StreamClose = local_28->BaseClose;
        return local_28;
      }
      free(local_28);
      local_28 = (TFileStream *)0x0;
    }
    szFileName_local = (TCHAR *)local_28;
  }
  else {
    SetLastError(0x5f);
    szFileName_local = (TCHAR *)0x0;
  }
  return (TFileStream *)szFileName_local;
}

Assistant:

TFileStream * FileStream_CreateFile(
    const TCHAR * szFileName,
    DWORD dwStreamFlags)
{
    TFileStream * pStream;

    // We only support creation of flat, local file
    if((dwStreamFlags & (STREAM_PROVIDERS_MASK)) != (STREAM_PROVIDER_FLAT | BASE_PROVIDER_FILE))
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return NULL;
    }

    // Allocate file stream structure for flat stream
    pStream = AllocateFileStream(szFileName, sizeof(TBlockStream), dwStreamFlags);
    if(pStream != NULL)
    {
        // Attempt to create the disk file
        if(BaseFile_Create(pStream))
        {
            // Fill the stream provider functions
            pStream->StreamRead    = pStream->BaseRead;
            pStream->StreamWrite   = pStream->BaseWrite;
            pStream->StreamResize  = pStream->BaseResize;
            pStream->StreamGetSize = pStream->BaseGetSize;
            pStream->StreamGetPos  = pStream->BaseGetPos;
            pStream->StreamClose   = pStream->BaseClose;
            return pStream;
        }

        // File create failed, delete the stream
        CASC_FREE(pStream);
        pStream = NULL;
    }

    // Return the stream
    return pStream;
}